

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

Parse * verona::parser(void)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  Parse *this;
  element_type *peVar3;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined1 auVar6 [8];
  undefined1 auVar7 [8];
  long lVar8;
  Parse *in_RDI;
  Located<const_char_*> s;
  Located<const_char_*> s_00;
  Located<const_char_*> s_01;
  Located<const_char_*> s_02;
  Located<const_char_*> s_03;
  Located<const_char_*> s_04;
  Located<const_char_*> s_05;
  Located<const_char_*> s_06;
  Located<const_char_*> s_07;
  Located<const_char_*> s_08;
  Located<const_char_*> s_09;
  Located<const_char_*> s_10;
  Located<const_char_*> s_11;
  Located<const_char_*> s_12;
  Located<const_char_*> s_13;
  Located<const_char_*> s_14;
  Located<const_char_*> s_15;
  Located<const_char_*> s_16;
  Located<const_char_*> s_17;
  Located<const_char_*> s_18;
  Located<const_char_*> s_19;
  Located<const_char_*> s_20;
  Located<const_char_*> s_21;
  Located<const_char_*> s_22;
  Located<const_char_*> s_23;
  Located<const_char_*> s_24;
  Located<const_char_*> s_25;
  Located<const_char_*> s_26;
  Located<const_char_*> s_27;
  Located<const_char_*> s_28;
  Located<const_char_*> s_29;
  Located<const_char_*> s_30;
  Located<const_char_*> s_31;
  Located<const_char_*> s_32;
  Located<const_char_*> s_33;
  Located<const_char_*> s_34;
  Located<const_char_*> s_35;
  Located<const_char_*> s_36;
  Located<const_char_*> s_37;
  Located<const_char_*> s_38;
  Located<const_char_*> s_39;
  Located<const_char_*> s_40;
  Located<const_char_*> s_41;
  Located<const_char_*> s_42;
  Located<const_char_*> s_43;
  Located<const_char_*> s_44;
  Located<const_char_*> s_45;
  Located<const_char_*> s_46;
  Located<const_char_*> s_47;
  Located<const_char_*> s_48;
  Located<const_char_*> s_49;
  Located<const_char_*> s_50;
  Located<const_char_*> s_51;
  Located<const_char_*> s_52;
  Located<const_char_*> s_53;
  Located<const_char_*> s_54;
  Located<const_char_*> s_55;
  Located<const_char_*> s_56;
  Located<const_char_*> s_57;
  Located<const_char_*> s_58;
  initializer_list<std::pair<trieste::Token,_std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>_>_>
  g;
  initializer_list<std::shared_ptr<trieste::detail::RuleDef>_> r;
  initializer_list<std::shared_ptr<trieste::detail::RuleDef>_> r_00;
  initializer_list<std::shared_ptr<trieste::detail::RuleDef>_> r_01;
  allocator<char> local_e09;
  shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_> indent;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_df8;
  Parse *local_de0;
  __shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> local_dd8;
  __shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2> local_dc8;
  __shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> local_db8;
  __shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2> local_da8;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_d98;
  shared_ptr<Str> str;
  shared_ptr<unsigned_long> depth;
  __allocator_type __a2;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_d48;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_d38;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_d28;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_d18;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_d08;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_cf8;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_ce8;
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  local_cd8;
  shared_ptr<trieste::Location> start_location;
  shared_ptr<re2::RE2> re_dir;
  _Any_data local_ca8;
  code *local_c98;
  code *pcStack_c90;
  _Any_data local_c88;
  code *local_c78;
  code *pcStack_c70;
  _Any_data local_c68;
  code *local_c58;
  code *pcStack_c50;
  _Any_data local_c48;
  code *local_c38;
  code *pcStack_c30;
  _Any_data local_c28;
  code *local_c18;
  code *pcStack_c10;
  _Any_data local_c08;
  code *local_bf8;
  code *pcStack_bf0;
  _Any_data local_be8;
  code *local_bd8;
  code *pcStack_bd0;
  _Any_data local_bc8;
  code *local_bb8;
  code *pcStack_bb0;
  _Any_data local_ba8;
  code *local_b98;
  code *pcStack_b90;
  _Any_data local_b88;
  code *local_b78;
  code *pcStack_b70;
  _Any_data local_b68;
  code *local_b58;
  code *pcStack_b50;
  _Any_data local_b48;
  code *local_b38;
  code *pcStack_b30;
  _Any_data local_b28;
  code *local_b18;
  code *pcStack_b10;
  _Any_data local_b08;
  code *local_af8;
  code *pcStack_af0;
  _Any_data local_ae8;
  code *local_ad8;
  code *pcStack_ad0;
  _Any_data local_ac8;
  code *local_ab8;
  code *pcStack_ab0;
  _Any_data local_aa8;
  code *local_a98;
  code *pcStack_a90;
  _Any_data local_a88;
  code *local_a78;
  code *pcStack_a70;
  _Any_data local_a68;
  code *local_a58;
  code *pcStack_a50;
  _Any_data local_a48;
  code *local_a38;
  code *pcStack_a30;
  undefined1 local_a28 [8];
  undefined1 auStack_a20 [8];
  __shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> local_a18;
  trieste local_a08 [8];
  undefined1 *local_a00;
  undefined1 local_9f8 [32];
  undefined1 *local_9d8;
  undefined1 local_9d0 [24];
  trieste local_9b8 [8];
  undefined1 *local_9b0;
  undefined1 local_9a8 [32];
  undefined1 *local_988;
  undefined1 local_980 [24];
  trieste local_968 [8];
  undefined1 *local_960;
  undefined1 local_958 [32];
  undefined1 *local_938;
  undefined1 local_930 [24];
  trieste local_918 [8];
  undefined1 *local_910;
  undefined1 local_908 [32];
  trieste local_8e8 [16];
  trieste local_8d8 [16];
  trieste local_8c8 [16];
  trieste local_8b8 [16];
  trieste local_8a8 [16];
  trieste local_898 [16];
  trieste local_888 [16];
  trieste local_878 [16];
  trieste local_868 [16];
  trieste local_858 [16];
  trieste local_848 [16];
  trieste local_838 [16];
  trieste local_828 [16];
  trieste local_818 [16];
  trieste local_808 [16];
  trieste local_7f8 [16];
  trieste local_7e8 [16];
  trieste local_7d8 [16];
  trieste local_7c8 [16];
  trieste local_7b8 [16];
  trieste local_7a8 [16];
  trieste local_798 [16];
  trieste local_788 [16];
  trieste local_778 [16];
  trieste local_768 [16];
  trieste local_758 [16];
  trieste local_748 [16];
  trieste local_738 [16];
  trieste local_728 [16];
  trieste local_718 [16];
  trieste local_708 [16];
  trieste local_6f8 [16];
  trieste local_6e8 [16];
  _Any_data local_6d8;
  code *local_6c8;
  code *local_6c0;
  _Any_data local_6b8;
  code *local_6a8;
  code *local_6a0;
  _Any_data local_698;
  code *local_688;
  code *local_680;
  _Any_data local_678;
  code *local_668;
  code *local_660;
  _Any_data local_658;
  code *local_648;
  code *local_640;
  _Any_data local_638;
  code *local_628;
  code *local_620;
  _Any_data local_618;
  code *local_608;
  code *local_600;
  _Any_data local_5f8;
  code *local_5e8;
  code *local_5e0;
  _Any_data local_5d8;
  code *local_5c8;
  code *local_5c0;
  _Any_data local_5b8;
  code *local_5a8;
  code *local_5a0;
  _Any_data local_598;
  code *local_588;
  code *local_580;
  _Any_data local_578;
  code *local_568;
  code *local_560;
  _Any_data local_558;
  code *local_548;
  code *local_540;
  _Any_data local_538;
  code *local_528;
  code *local_520;
  _Any_data local_518;
  code *local_508;
  code *local_500;
  _Any_data local_4f8;
  code *local_4e8;
  code *local_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  code *local_4c0;
  _Any_data local_4b8;
  code *local_4a8;
  code *local_4a0;
  _Any_data local_498;
  code *local_488;
  code *local_480;
  _Any_data local_478;
  code *local_468;
  code *local_460;
  _Any_data local_458;
  code *local_448;
  code *local_440;
  _Any_data local_438;
  code *local_428;
  code *local_420;
  _Any_data local_418;
  code *local_408;
  code *local_400;
  _Any_data local_3f8;
  code *local_3e8;
  code *local_3e0;
  _Any_data local_3d8;
  code *local_3c8;
  code *local_3c0;
  _Any_data local_3b8;
  code *local_3a8;
  code *local_3a0;
  _Any_data local_398;
  code *local_388;
  code *local_380;
  _Any_data local_378;
  code *local_368;
  code *local_360;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  _Any_data local_338;
  code *local_328;
  code *local_320;
  _Any_data local_318;
  code *local_308;
  code *local_300;
  _Any_data local_2f8;
  code *local_2e8;
  code *local_2e0;
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  _Any_data local_2b8;
  code *local_2a8;
  code *local_2a0;
  _Any_data local_298;
  code *local_288;
  code *local_280;
  _Any_data local_278;
  code *local_268;
  code *local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  _Any_data local_218;
  code *local_208;
  code *local_200;
  _Any_data local_1f8;
  code *local_1e8;
  code *local_1e0;
  _Any_data local_1d8;
  code *local_1c8;
  code *local_1c0;
  _Any_data local_1b8;
  code *local_1a8;
  code *local_1a0;
  _Any_data local_198;
  code *local_188;
  code *local_180;
  _Any_data local_178;
  code *local_168;
  code *local_160;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  _Any_data local_138;
  code *local_128;
  code *local_120;
  _Any_data local_118;
  code *local_108;
  code *local_100;
  _Any_data local_f8;
  code *local_e8;
  code *local_e0;
  _Any_data local_d8;
  code *local_c8;
  code *local_c0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  _Any_data local_98;
  code *local_88;
  code *local_80;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  trieste::Parse::Parse(in_RDI,subdirectories,(Wellformed *)wfParser);
  local_de0 = in_RDI;
  ::std::make_shared<re2::RE2,char_const(&)[27]>((char (*) [27])&re_dir);
  local_a28 = (undefined1  [8])((ulong)(uint)local_a28._4_4_ << 0x20);
  ::std::make_shared<unsigned_long,int>((int *)&depth);
  str.super___shared_ptr<Str,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  local_a28 = (undefined1  [8])&__a2;
  (str.super___shared_ptr<Str,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_use_count = 1;
  (str.super___shared_ptr<Str,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->_M_weak_count = 1;
  (str.super___shared_ptr<Str,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0026d480;
  str.super___shared_ptr<Str,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (str.super___shared_ptr<Str,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 1);
  auStack_a20 = (undefined1  [8])0x0;
  str.super___shared_ptr<Str,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
  _vptr__Sp_counted_base = (_func_int **)0x0;
  str.super___shared_ptr<Str,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_use_count = 0;
  str.super___shared_ptr<Str,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]._M_weak_count = 0;
  ::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Str,_std::allocator<Str>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Str,_std::allocator<Str>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)local_a28);
  ::std::make_shared<std::vector<unsigned_long,std::allocator<unsigned_long>>>();
  ::std::make_shared<trieste::Location>();
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (indent.
             super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr,&restart);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = ::std::
             _Function_handler<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:55:15)>
             ::_M_invoke;
  local_48 = ::std::
             _Function_handler<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:55:15)>
             ::_M_manager;
  ::std::function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)>::operator=
            ((function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)> *)
             &in_RDI->prefile_,
             (function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)> *)
             &local_58);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_58);
  ::std::__shared_ptr<re2::RE2,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<re2::RE2,_(__gnu_cxx::_Lock_policy)2> *)local_a28,
             &re_dir.super___shared_ptr<re2::RE2,_(__gnu_cxx::_Lock_policy)2>);
  local_a38 = (code *)0x0;
  pcStack_a30 = (code *)0x0;
  local_a48._M_unused._M_object = (void *)0x0;
  local_a48._8_8_ = 0;
  local_a48._M_unused._M_object = operator_new(0x10);
  auVar7 = auStack_a20;
  auVar6 = local_a28;
  auStack_a20 = (undefined1  [8])0x0;
  local_a28 = (undefined1  [8])0x0;
  *(undefined1 (*) [8])local_a48._M_unused._0_8_ = auVar6;
  *(undefined1 (*) [8])((long)local_a48._M_unused._0_8_ + 8) = auVar7;
  pcStack_a30 = ::std::
                _Function_handler<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:57:14)>
                ::_M_invoke;
  local_a38 = ::std::
              _Function_handler<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:57:14)>
              ::_M_manager;
  ::std::function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)>::operator=
            ((function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)> *)
             &in_RDI->predir_,
             (function<bool_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&)> *)
             &local_a48);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_a48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_a20);
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_60 = ::std::
             _Function_handler<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:61:17)>
             ::_M_invoke;
  local_68 = ::std::
             _Function_handler<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:61:17)>
             ::_M_manager;
  ::std::
  function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
  ::operator=(&in_RDI->postparse_,
              (function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
               *)&local_78);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_78);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr((__shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)local_a28,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  ::std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2> *)(auStack_a20 + 8),
             &depth.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>);
  local_a58 = (code *)0x0;
  pcStack_a50 = (code *)0x0;
  local_a68._M_unused._M_object = (void *)0x0;
  local_a68._8_8_ = 0;
  local_a68._M_unused._M_object = operator_new(0x20);
  _Var2._M_pi = local_a18._M_refcount._M_pi;
  peVar3 = local_a18._M_ptr;
  auVar7 = auStack_a20;
  auVar6 = local_a28;
  auStack_a20 = (undefined1  [8])0x0;
  local_a28 = (undefined1  [8])0x0;
  local_a18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined1 (*) [8])local_a68._M_unused._0_8_ = auVar6;
  *(undefined1 (*) [8])((long)local_a68._M_unused._0_8_ + 8) = auVar7;
  local_a18._M_ptr = (element_type *)0x0;
  *(element_type **)((long)local_a68._M_unused._0_8_ + 0x10) = peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a68._M_unused._0_8_ + 0x18) =
       _Var2._M_pi;
  pcStack_a50 = ::std::
                _Function_handler<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:70:16)>
                ::_M_invoke;
  local_a58 = ::std::
              _Function_handler<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:70:16)>
              ::_M_manager;
  ::std::
  function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
  ::operator=(&local_de0->postfile_,
              (function<void_(const_trieste::Parse_&,_const_std::filesystem::__cxx11::path_&,_std::shared_ptr<trieste::NodeDef>)>
               *)&local_a68);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_a68);
  parser()::$_3::~__3((__3 *)local_a28);
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&__a2,"start",&local_e09);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_df8,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_a78 = (code *)0x0;
  pcStack_a70 = (code *)0x0;
  local_a88._M_unused._M_object = (void *)0x0;
  local_a88._8_8_ = 0;
  local_a88._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_df8._M_refcount._M_pi;
  peVar1 = local_df8._M_ptr;
  local_df8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_df8._M_ptr = (element_type *)0x0;
  *(element_type **)local_a88._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_a88._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_a70 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:80:11)>
                ::_M_invoke;
  local_a78 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:80:11)>
              ::_M_manager;
  s.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026ced0;
  s.value = "\r?\n(?:[[:blank:]]*\r?\n)+([[:blank:]]*)";
  trieste::operator>>((trieste *)local_a28,s,(ParseEffect *)&local_a88);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_d98,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_a98 = (code *)0x0;
  pcStack_a90 = (code *)0x0;
  local_aa8._M_unused._M_object = (void *)0x0;
  local_aa8._8_8_ = 0;
  local_aa8._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_d98._M_refcount._M_pi;
  peVar1 = local_d98._M_ptr;
  local_d98._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d98._M_ptr = (element_type *)0x0;
  *(element_type **)local_aa8._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_aa8._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_a90 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:87:11)>
                ::_M_invoke;
  local_a98 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:87:11)>
              ::_M_manager;
  s_00.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cee8;
  s_00.value = "\r?\n([[:blank:]]*(\\{)[[:blank:]]*)";
  trieste::operator>>((trieste *)(auStack_a20 + 8),s_00,(ParseEffect *)&local_aa8);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_cd8,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_ab8 = (code *)0x0;
  pcStack_ab0 = (code *)0x0;
  local_ac8._M_unused._M_object = (void *)0x0;
  local_ac8._8_8_ = 0;
  local_ac8._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_cd8._M_refcount._M_pi;
  peVar1 = local_cd8._M_ptr;
  local_cd8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_cd8._M_ptr = (element_type *)0x0;
  *(element_type **)local_ac8._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_ac8._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_ab0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:94:11)>
                ::_M_invoke;
  local_ab8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:94:11)>
              ::_M_manager;
  s_01.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cf00;
  s_01.value = "\r?\n([[:blank:]]*)";
  trieste::operator>>(local_a08,s_01,(ParseEffect *)&local_ac8);
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_80 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:118:27)>
             ::_M_invoke;
  local_88 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:118:27)>
             ::_M_manager;
  s_02.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cf18;
  s_02.value = "[[:blank:]]+";
  trieste::operator>>((trieste *)local_9f8,s_02,(ParseEffect *)&local_98);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:121:16)>
             ::_M_invoke;
  local_a8 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:121:16)>
             ::_M_manager;
  s_03.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cf30;
  s_03.value = ";";
  trieste::operator>>((trieste *)(local_9f8 + 0x10),s_03,(ParseEffect *)&local_b8);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_ce8,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_ad8 = (code *)0x0;
  pcStack_ad0 = (code *)0x0;
  local_ae8._M_unused._M_object = (void *)0x0;
  local_ae8._8_8_ = 0;
  local_ae8._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_ce8._M_refcount._M_pi;
  peVar1 = local_ce8._M_ptr;
  local_ce8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_ce8._M_ptr = (element_type *)0x0;
  *(element_type **)local_ae8._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_ae8._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_ad0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:125:11)>
                ::_M_invoke;
  local_ad8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:125:11)>
              ::_M_manager;
  s_04.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cf48;
  s_04.value = "=>";
  trieste::operator>>((trieste *)&local_9d8,s_04,(ParseEffect *)&local_ae8);
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c0 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:133:16)>
             ::_M_invoke;
  local_c8 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:133:16)>
             ::_M_manager;
  s_05.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cf60;
  s_05.value = ",";
  trieste::operator>>((trieste *)(local_9d0 + 8),s_05,(ParseEffect *)&local_d8);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_cf8,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_af8 = (code *)0x0;
  pcStack_af0 = (code *)0x0;
  local_b08._M_unused._M_object = (void *)0x0;
  local_b08._8_8_ = 0;
  local_b08._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_cf8._M_refcount._M_pi;
  peVar1 = local_cf8._M_ptr;
  local_cf8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_cf8._M_ptr = (element_type *)0x0;
  *(element_type **)local_b08._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b08._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_af0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:137:11)>
                ::_M_invoke;
  local_af8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:137:11)>
              ::_M_manager;
  s_06.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cf78;
  s_06.value = "(\\()[[:blank:]]*";
  trieste::operator>>(local_9b8,s_06,(ParseEffect *)&local_b08);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_d08,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_b18 = (code *)0x0;
  pcStack_b10 = (code *)0x0;
  local_b28._M_unused._M_object = (void *)0x0;
  local_b28._8_8_ = 0;
  local_b28._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_d08._M_refcount._M_pi;
  peVar1 = local_d08._M_ptr;
  local_d08._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d08._M_ptr = (element_type *)0x0;
  *(element_type **)local_b28._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b28._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_b10 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:143:11)>
                ::_M_invoke;
  local_b18 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:143:11)>
              ::_M_manager;
  s_07.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cf90;
  s_07.value = "\\)";
  trieste::operator>>((trieste *)local_9a8,s_07,(ParseEffect *)&local_b28);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_d18,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_b38 = (code *)0x0;
  pcStack_b30 = (code *)0x0;
  local_b48._M_unused._M_object = (void *)0x0;
  local_b48._8_8_ = 0;
  local_b48._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_d18._M_refcount._M_pi;
  peVar1 = local_d18._M_ptr;
  local_d18._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d18._M_ptr = (element_type *)0x0;
  *(element_type **)local_b48._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b48._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_b30 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:151:11)>
                ::_M_invoke;
  local_b38 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:151:11)>
              ::_M_manager;
  s_08.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cfa8;
  s_08.value = "(\\[)[[:blank:]]*";
  trieste::operator>>((trieste *)(local_9a8 + 0x10),s_08,(ParseEffect *)&local_b48);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_d28,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_b58 = (code *)0x0;
  pcStack_b50 = (code *)0x0;
  local_b68._M_unused._M_object = (void *)0x0;
  local_b68._8_8_ = 0;
  local_b68._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_d28._M_refcount._M_pi;
  peVar1 = local_d28._M_ptr;
  local_d28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d28._M_ptr = (element_type *)0x0;
  *(element_type **)local_b68._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b68._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_b50 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:157:11)>
                ::_M_invoke;
  local_b58 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:157:11)>
              ::_M_manager;
  s_09.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cfc0;
  s_09.value = "\\]";
  trieste::operator>>((trieste *)&local_988,s_09,(ParseEffect *)&local_b68);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_d38,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_b78 = (code *)0x0;
  pcStack_b70 = (code *)0x0;
  local_b88._M_unused._M_object = (void *)0x0;
  local_b88._8_8_ = 0;
  local_b88._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_d38._M_refcount._M_pi;
  peVar1 = local_d38._M_ptr;
  local_d38._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d38._M_ptr = (element_type *)0x0;
  *(element_type **)local_b88._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_b88._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_b70 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:165:11)>
                ::_M_invoke;
  local_b78 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:165:11)>
              ::_M_manager;
  s_10.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cfd8;
  s_10.value = "(\\{)[[:blank:]]*";
  trieste::operator>>((trieste *)(local_980 + 8),s_10,(ParseEffect *)&local_b88);
  ::std::
  __shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&local_d48,
                 &indent.
                  super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  local_b98 = (code *)0x0;
  pcStack_b90 = (code *)0x0;
  local_ba8._M_unused._M_object = (void *)0x0;
  local_ba8._8_8_ = 0;
  local_ba8._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_d48._M_refcount._M_pi;
  peVar1 = local_d48._M_ptr;
  local_d48._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d48._M_ptr = (element_type *)0x0;
  *(element_type **)local_ba8._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_ba8._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_b90 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:171:11)>
                ::_M_invoke;
  local_b98 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:171:11)>
              ::_M_manager;
  s_11.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026cff0;
  s_11.value = "\\}";
  trieste::operator>>(local_968,s_11,(ParseEffect *)&local_ba8);
  local_f8._M_unused._M_object = (void *)0x0;
  local_f8._8_8_ = 0;
  local_e0 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:178:22)>
             ::_M_invoke;
  local_e8 = ::std::
             _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:178:22)>
             ::_M_manager;
  s_12.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d008;
  s_12.value = "true\\b";
  trieste::operator>>((trieste *)local_958,s_12,(ParseEffect *)&local_f8);
  local_118._M_unused._M_object = (void *)0x0;
  local_118._8_8_ = 0;
  local_100 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:179:23)>
              ::_M_invoke;
  local_108 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:179:23)>
              ::_M_manager;
  s_13.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d020;
  s_13.value = "false\\b";
  trieste::operator>>((trieste *)(local_958 + 0x10),s_13,(ParseEffect *)&local_118);
  local_138._M_unused._M_object = (void *)0x0;
  local_138._8_8_ = 0;
  local_120 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:183:11)>
              ::_M_invoke;
  local_128 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:183:11)>
              ::_M_manager;
  s_14.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d038;
  s_14.value = "0x[_[:xdigit:]]+\\.[_[:xdigit:]]+(?:p[+-][_[:digit:]]+)?\\b";
  trieste::operator>>((trieste *)&local_938,s_14,(ParseEffect *)&local_138);
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:187:11)>
              ::_M_invoke;
  local_148 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:187:11)>
              ::_M_manager;
  s_15.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d050;
  s_15.value = "[[:digit:]][_[:digit:]]*\\.[_[:digit:]]+(?:e[+-]?[_[:digit:]]+)?\\b";
  trieste::operator>>((trieste *)(local_930 + 8),s_15,(ParseEffect *)&local_158);
  local_178._M_unused._M_object = (void *)0x0;
  local_178._8_8_ = 0;
  local_160 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:190:26)>
              ::_M_invoke;
  local_168 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:190:26)>
              ::_M_manager;
  s_16.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d068;
  s_16.value = "0b[_01]+\\b";
  trieste::operator>>(local_918,s_16,(ParseEffect *)&local_178);
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_180 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:193:32)>
              ::_M_invoke;
  local_188 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:193:32)>
              ::_M_manager;
  s_17.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d080;
  s_17.value = "0o[_01234567]+\\b";
  trieste::operator>>((trieste *)local_908,s_17,(ParseEffect *)&local_198);
  local_1b8._M_unused._M_object = (void *)0x0;
  local_1b8._8_8_ = 0;
  local_1a0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:196:34)>
              ::_M_invoke;
  local_1a8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:196:34)>
              ::_M_manager;
  s_18.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d098;
  s_18.value = "0x[_[:xdigit:]]+\\b";
  trieste::operator>>((trieste *)(local_908 + 0x10),s_18,(ParseEffect *)&local_1b8);
  local_1d8._M_unused._M_object = (void *)0x0;
  local_1d8._8_8_ = 0;
  local_1c0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:199:42)>
              ::_M_invoke;
  local_1c8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:199:42)>
              ::_M_manager;
  s_19.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d0b0;
  s_19.value = "[[:digit:]][_[:digit:]]*\\b";
  trieste::operator>>(local_8e8,s_19,(ParseEffect *)&local_1d8);
  local_1f8._M_unused._M_object = (void *)0x0;
  local_1f8._8_8_ = 0;
  local_1e0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:202:37)>
              ::_M_invoke;
  local_1e8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:202:37)>
              ::_M_manager;
  s_20.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d0c8;
  s_20.value = "\"((?:\\\"|[^\"])*?)\"";
  trieste::operator>>(local_8d8,s_20,(ParseEffect *)&local_1f8);
  ::std::shared_ptr<Str>::shared_ptr((shared_ptr<Str> *)&local_db8,&str);
  ::std::__shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_da8,
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>);
  local_bb8 = (code *)0x0;
  pcStack_bb0 = (code *)0x0;
  local_bc8._M_unused._M_object = (void *)0x0;
  local_bc8._8_8_ = 0;
  local_bc8._M_unused._M_object = operator_new(0x20);
  _Var5._M_pi = local_da8._M_refcount._M_pi;
  peVar4 = local_da8._M_ptr;
  _Var2._M_pi = local_db8._M_refcount._M_pi;
  peVar3 = local_db8._M_ptr;
  local_db8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_db8._M_ptr = (element_type *)0x0;
  local_da8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_da8._M_ptr = (element_type *)0x0;
  *(element_type **)local_bc8._M_unused._0_8_ = peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_bc8._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  *(element_type **)((long)local_bc8._M_unused._0_8_ + 0x10) = peVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_bc8._M_unused._0_8_ + 0x18) =
       _Var5._M_pi;
  pcStack_bb0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:206:11)>
                ::_M_invoke;
  local_bb8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:206:11)>
              ::_M_manager;
  s_21.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d0e0;
  s_21.value = "([\']+)\"([^\"]*)";
  trieste::operator>>(local_8c8,s_21,(ParseEffect *)&local_bc8);
  local_218._M_unused._M_object = (void *)0x0;
  local_218._8_8_ = 0;
  local_200 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:215:32)>
              ::_M_invoke;
  local_208 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:215:32)>
              ::_M_manager;
  s_22.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d0f8;
  s_22.value = "\'((?:\\\'|[^\'])*)\'";
  trieste::operator>>(local_8b8,s_22,(ParseEffect *)&local_218);
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = 0;
  local_220 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:218:44)>
              ::_M_invoke;
  local_228 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:218:44)>
              ::_M_manager;
  s_23.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d110;
  s_23.value = ":\\[((?:[^\\]]|\\][^:])*)\\]:";
  trieste::operator>>(local_8a8,s_23,(ParseEffect *)&local_238);
  local_258._M_unused._M_object = (void *)0x0;
  local_258._8_8_ = 0;
  local_240 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:221:25)>
              ::_M_invoke;
  local_248 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:221:25)>
              ::_M_manager;
  s_24.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d128;
  s_24.value = "//[^\r\n]*";
  trieste::operator>>(local_898,s_24,(ParseEffect *)&local_258);
  ::std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_dd8,&depth.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>);
  ::std::__shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_dc8,
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>);
  local_bd8 = (code *)0x0;
  pcStack_bd0 = (code *)0x0;
  local_be8._M_unused._M_object = (void *)0x0;
  local_be8._8_8_ = 0;
  local_be8._M_unused._M_object = operator_new(0x20);
  _Var5._M_pi = local_dc8._M_refcount._M_pi;
  peVar4 = local_dc8._M_ptr;
  _Var2._M_pi = local_dd8._M_refcount._M_pi;
  peVar3 = local_dd8._M_ptr;
  local_dd8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_dd8._M_ptr = (element_type *)0x0;
  local_dc8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_dc8._M_ptr = (element_type *)0x0;
  *(element_type **)local_be8._M_unused._0_8_ = peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_be8._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  *(element_type **)((long)local_be8._M_unused._0_8_ + 0x10) = peVar4;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_be8._M_unused._0_8_ + 0x18) =
       _Var5._M_pi;
  pcStack_bd0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:225:11)>
                ::_M_invoke;
  local_bd8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:225:11)>
              ::_M_manager;
  s_25.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d140;
  s_25.value = "/\\*";
  trieste::operator>>(local_888,s_25,(ParseEffect *)&local_be8);
  local_278._M_unused._M_object = (void *)0x0;
  local_278._8_8_ = 0;
  local_260 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:234:11)>
              ::_M_invoke;
  local_268 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:234:11)>
              ::_M_manager;
  s_26.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d158;
  s_26.value = "use\\b";
  trieste::operator>>(local_878,s_26,(ParseEffect *)&local_278);
  local_298._M_unused._M_object = (void *)0x0;
  local_298._8_8_ = 0;
  local_280 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:240:11)>
              ::_M_invoke;
  local_288 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:240:11)>
              ::_M_manager;
  s_27.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d170;
  s_27.value = "type\\b";
  trieste::operator>>(local_868,s_27,(ParseEffect *)&local_298);
  local_2b8._M_unused._M_object = (void *)0x0;
  local_2b8._8_8_ = 0;
  local_2a0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:246:11)>
              ::_M_invoke;
  local_2a8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:246:11)>
              ::_M_manager;
  s_28.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d188;
  s_28.value = "class\\b";
  trieste::operator>>(local_858,s_28,(ParseEffect *)&local_2b8);
  local_2d8._M_unused._M_object = (void *)0x0;
  local_2d8._8_8_ = 0;
  local_2c0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:251:23)>
              ::_M_invoke;
  local_2c8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:251:23)>
              ::_M_manager;
  s_29.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d1a0;
  s_29.value = "where\\b";
  trieste::operator>>(local_848,s_29,(ParseEffect *)&local_2d8);
  local_2f8._M_unused._M_object = (void *)0x0;
  local_2f8._8_8_ = 0;
  local_2e0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:252:21)>
              ::_M_invoke;
  local_2e8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:252:21)>
              ::_M_manager;
  s_30.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d1b8;
  s_30.value = "var\\b";
  trieste::operator>>(local_838,s_30,(ParseEffect *)&local_2f8);
  local_318._M_unused._M_object = (void *)0x0;
  local_318._8_8_ = 0;
  local_300 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:253:21)>
              ::_M_invoke;
  local_308 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:253:21)>
              ::_M_manager;
  s_31.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d1d0;
  s_31.value = "let\\b";
  trieste::operator>>(local_828,s_31,(ParseEffect *)&local_318);
  local_338._M_unused._M_object = (void *)0x0;
  local_338._8_8_ = 0;
  local_320 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:254:21)>
              ::_M_invoke;
  local_328 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:254:21)>
              ::_M_manager;
  s_32.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d1e8;
  s_32.value = "ref\\b";
  trieste::operator>>(local_818,s_32,(ParseEffect *)&local_338);
  local_358._M_unused._M_object = (void *)0x0;
  local_358._8_8_ = 0;
  local_340 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:255:22)>
              ::_M_invoke;
  local_348 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:255:22)>
              ::_M_manager;
  s_33.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d200;
  s_33.value = "Self\\b";
  trieste::operator>>(local_808,s_33,(ParseEffect *)&local_358);
  local_378._M_unused._M_object = (void *)0x0;
  local_378._8_8_ = 0;
  local_360 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:256:20)>
              ::_M_invoke;
  local_368 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:256:20)>
              ::_M_manager;
  s_34.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d218;
  s_34.value = "if\\b";
  trieste::operator>>(local_7f8,s_34,(ParseEffect *)&local_378);
  local_398._M_unused._M_object = (void *)0x0;
  local_398._8_8_ = 0;
  local_380 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:257:22)>
              ::_M_invoke;
  local_388 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:257:22)>
              ::_M_manager;
  s_35.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d230;
  s_35.value = "else\\b";
  trieste::operator>>(local_7e8,s_35,(ParseEffect *)&local_398);
  local_3b8._M_unused._M_object = (void *)0x0;
  local_3b8._8_8_ = 0;
  local_3a0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:258:21)>
              ::_M_invoke;
  local_3a8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:258:21)>
              ::_M_manager;
  s_36.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d248;
  s_36.value = "new\\b";
  trieste::operator>>(local_7d8,s_36,(ParseEffect *)&local_3b8);
  local_3d8._M_unused._M_object = (void *)0x0;
  local_3d8._8_8_ = 0;
  local_3c0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:259:21)>
              ::_M_invoke;
  local_3c8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:259:21)>
              ::_M_manager;
  s_37.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d260;
  s_37.value = "try\\b";
  trieste::operator>>(local_7c8,s_37,(ParseEffect *)&local_3d8);
  local_3f8._M_unused._M_object = (void *)0x0;
  local_3f8._8_8_ = 0;
  local_3e0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:260:21)>
              ::_M_invoke;
  local_3e8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:260:21)>
              ::_M_manager;
  s_38.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d278;
  s_38.value = "iso\\b";
  trieste::operator>>(local_7b8,s_38,(ParseEffect *)&local_3f8);
  local_418._M_unused._M_object = (void *)0x0;
  local_418._8_8_ = 0;
  local_400 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:261:21)>
              ::_M_invoke;
  local_408 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:261:21)>
              ::_M_manager;
  s_39.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d290;
  s_39.value = "mut\\b";
  trieste::operator>>(local_7a8,s_39,(ParseEffect *)&local_418);
  local_438._M_unused._M_object = (void *)0x0;
  local_438._8_8_ = 0;
  local_420 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:262:21)>
              ::_M_invoke;
  local_428 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:262:21)>
              ::_M_manager;
  s_40.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d2a8;
  s_40.value = "imm\\b";
  trieste::operator>>(local_798,s_40,(ParseEffect *)&local_438);
  local_458._M_unused._M_object = (void *)0x0;
  local_458._8_8_ = 0;
  local_440 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:265:19)>
              ::_M_invoke;
  local_448 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:265:19)>
              ::_M_manager;
  s_41.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d2c0;
  s_41.value = "_\\b";
  trieste::operator>>(local_788,s_41,(ParseEffect *)&local_458);
  local_478._M_unused._M_object = (void *)0x0;
  local_478._8_8_ = 0;
  local_460 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:269:11)>
              ::_M_invoke;
  local_468 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:269:11)>
              ::_M_manager;
  s_42.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d2d8;
  s_42.value = "_(?:_)+\\b";
  trieste::operator>>(local_778,s_42,(ParseEffect *)&local_478);
  local_498._M_unused._M_object = (void *)0x0;
  local_498._8_8_ = 0;
  local_480 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:275:43)>
              ::_M_invoke;
  local_488 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:275:43)>
              ::_M_manager;
  s_43.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d2f0;
  s_43.value = "[_[:alpha:]][_[:alnum:]]*\\b";
  trieste::operator>>(local_768,s_43,(ParseEffect *)&local_498);
  local_4b8._M_unused._M_object = (void *)0x0;
  local_4b8._8_8_ = 0;
  local_4a0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:278:24)>
              ::_M_invoke;
  local_4a8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:278:24)>
              ::_M_manager;
  s_44.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d308;
  s_44.value = "\\.\\.\\.";
  trieste::operator>>(local_758,s_44,(ParseEffect *)&local_4b8);
  local_4d8._M_unused._M_object = (void *)0x0;
  local_4d8._8_8_ = 0;
  local_4c0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:281:18)>
              ::_M_invoke;
  local_4c8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:281:18)>
              ::_M_manager;
  s_45.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d320;
  s_45.value = "\\.";
  trieste::operator>>(local_748,s_45,(ParseEffect *)&local_4d8);
  local_4f8._M_unused._M_object = (void *)0x0;
  local_4f8._8_8_ = 0;
  local_4e0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:284:18)>
              ::_M_invoke;
  local_4e8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:284:18)>
              ::_M_manager;
  s_46.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d338;
  s_46.value = ":::";
  trieste::operator>>(local_738,s_46,(ParseEffect *)&local_4f8);
  local_518._M_unused._M_object = (void *)0x0;
  local_518._8_8_ = 0;
  local_500 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:287:17)>
              ::_M_invoke;
  local_508 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:287:17)>
              ::_M_manager;
  s_47.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d350;
  s_47.value = "::";
  trieste::operator>>(local_728,s_47,(ParseEffect *)&local_518);
  local_538._M_unused._M_object = (void *)0x0;
  local_538._8_8_ = 0;
  local_520 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:290:16)>
              ::_M_invoke;
  local_528 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:290:16)>
              ::_M_manager;
  s_48.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d368;
  s_48.value = ":";
  trieste::operator>>(local_718,s_48,(ParseEffect *)&local_538);
  local_558._M_unused._M_object = (void *)0x0;
  local_558._8_8_ = 0;
  local_540 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:293:39)>
              ::_M_invoke;
  local_548 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:293:39)>
              ::_M_manager;
  s_49.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d380;
  s_49.value = "=[!#$%&*+-/<=>?@\\^`|~]+";
  trieste::operator>>(local_708,s_49,(ParseEffect *)&local_558);
  local_578._M_unused._M_object = (void *)0x0;
  local_578._8_8_ = 0;
  local_560 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:296:16)>
              ::_M_invoke;
  local_568 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:296:16)>
              ::_M_manager;
  s_50.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d398;
  s_50.value = "=";
  trieste::operator>>(local_6f8,s_50,(ParseEffect *)&local_578);
  local_598._M_unused._M_object = (void *)0x0;
  local_598._8_8_ = 0;
  local_580 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:299:38)>
              ::_M_invoke;
  local_588 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:299:38)>
              ::_M_manager;
  s_51.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d3b0;
  s_51.value = "[!#$%&*+-/<=>?@\\^`|~]+";
  trieste::operator>>(local_6e8,s_51,(ParseEffect *)&local_598);
  r._M_len = 0x35;
  r._M_array = (iterator)local_a28;
  trieste::Parse::operator()(local_de0,(string *)&__a2,r);
  lVar8 = 0x348;
  do {
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a28 + lVar8));
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_598);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_578);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_558);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_538);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_518);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_4f8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_4d8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_4b8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_498);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_478);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_458);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_438);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_418);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_3f8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_3d8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_3b8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_398);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_378);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_358);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_338);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_318);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_2f8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_2d8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_2b8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_298);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_278);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_be8);
  parser()::$_30::~__30((__30 *)&local_dd8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_258);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_238);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_218);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_bc8);
  parser()::$_26::~__26((__26 *)&local_db8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_1f8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_1d8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_1b8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_198);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_178);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_158);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_138);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_118);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_f8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_ba8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d48._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_b88);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d38._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_b68);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d28._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_b48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d18._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_b28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d08._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_b08);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_cf8._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_d8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_ae8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_ce8._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_98);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_ac8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_cd8._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_aa8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_d98._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_a88);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_df8._M_refcount);
  ::std::__cxx11::string::~string((string *)&__a2);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__a2,"string",(allocator<char> *)&local_d98);
  ::std::shared_ptr<Str>::shared_ptr((shared_ptr<Str> *)&local_db8,&str);
  this = local_de0;
  local_bf8 = (code *)0x0;
  pcStack_bf0 = (code *)0x0;
  local_c08._M_unused._M_object = (void *)0x0;
  local_c08._8_8_ = 0;
  local_c08._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_db8._M_refcount._M_pi;
  peVar3 = local_db8._M_ptr;
  local_db8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_db8._M_ptr = (element_type *)0x0;
  *(element_type **)local_c08._M_unused._0_8_ = peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_c08._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_bf0 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:305:11)>
                ::_M_invoke;
  local_bf8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:305:11)>
              ::_M_manager;
  s_52.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d3c8;
  s_52.value = "\"\'";
  trieste::operator>>((trieste *)local_a28,s_52,(ParseEffect *)&local_c08);
  ::std::shared_ptr<Str>::shared_ptr((shared_ptr<Str> *)&local_dd8,&str);
  local_c18 = (code *)0x0;
  pcStack_c10 = (code *)0x0;
  local_c28._M_unused._M_object = (void *)0x0;
  local_c28._8_8_ = 0;
  local_c28._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_dd8._M_refcount._M_pi;
  peVar3 = local_dd8._M_ptr;
  local_dd8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_dd8._M_ptr = (element_type *)0x0;
  *(element_type **)local_c28._M_unused._0_8_ = peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_c28._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_c10 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:313:11)>
                ::_M_invoke;
  local_c18 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:313:11)>
              ::_M_manager;
  s_53.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d3e0;
  s_53.value = "\'";
  trieste::operator>>((trieste *)(auStack_a20 + 8),s_53,(ParseEffect *)&local_c28);
  ::std::shared_ptr<Str>::shared_ptr((shared_ptr<Str> *)&local_df8,&str);
  local_c38 = (code *)0x0;
  pcStack_c30 = (code *)0x0;
  local_c48._M_unused._M_object = (void *)0x0;
  local_c48._8_8_ = 0;
  local_c48._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_df8._M_refcount._M_pi;
  peVar1 = local_df8._M_ptr;
  local_df8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_df8._M_ptr = (element_type *)0x0;
  *(element_type **)local_c48._M_unused._0_8_ = peVar1;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_c48._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_c30 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:322:16)>
                ::_M_invoke;
  local_c38 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:322:16)>
              ::_M_manager;
  s_54.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d3f8;
  s_54.value = ".";
  trieste::operator>>(local_a08,s_54,(ParseEffect *)&local_c48);
  r_00._M_len = 3;
  r_00._M_array = (iterator)local_a28;
  trieste::Parse::operator()(this,(string *)&__a2,r_00);
  lVar8 = 0x28;
  do {
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a28 + lVar8));
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_c48);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_df8._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_c28);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_dd8._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_c08);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_db8._M_refcount);
  ::std::__cxx11::string::~string((string *)&__a2);
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&__a2,"comment",(allocator<char> *)&local_df8);
  local_5b8._M_unused._M_object = (void *)0x0;
  local_5b8._8_8_ = 0;
  local_5a0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:327:23)>
              ::_M_invoke;
  local_5a8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:327:23)>
              ::_M_manager;
  s_55.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d410;
  s_55.value = "[^/\\*]+";
  trieste::operator>>((trieste *)local_a28,s_55,(ParseEffect *)&local_5b8);
  ::std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_db8,&depth.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>);
  local_c58 = (code *)0x0;
  pcStack_c50 = (code *)0x0;
  local_c68._M_unused._M_object = (void *)0x0;
  local_c68._8_8_ = 0;
  local_c68._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_db8._M_refcount._M_pi;
  peVar3 = local_db8._M_ptr;
  local_db8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_db8._M_ptr = (element_type *)0x0;
  *(element_type **)local_c68._M_unused._0_8_ = peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_c68._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_c50 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:328:19)>
                ::_M_invoke;
  local_c58 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:328:19)>
              ::_M_manager;
  s_56.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d428;
  s_56.value = "/\\*";
  trieste::operator>>((trieste *)(auStack_a20 + 8),s_56,(ParseEffect *)&local_c68);
  ::std::__shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_dd8,&depth.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>);
  local_c78 = (code *)0x0;
  pcStack_c70 = (code *)0x0;
  local_c88._M_unused._M_object = (void *)0x0;
  local_c88._8_8_ = 0;
  local_c88._M_unused._M_object = operator_new(0x10);
  _Var2._M_pi = local_dd8._M_refcount._M_pi;
  peVar3 = local_dd8._M_ptr;
  local_dd8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_dd8._M_ptr = (element_type *)0x0;
  *(element_type **)local_c88._M_unused._0_8_ = peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_c88._M_unused._0_8_ + 8) =
       _Var2._M_pi;
  pcStack_c70 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:331:11)>
                ::_M_invoke;
  local_c78 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:331:11)>
              ::_M_manager;
  s_57.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d440;
  s_57.value = "\\*/";
  trieste::operator>>(local_a08,s_57,(ParseEffect *)&local_c88);
  local_5d8._M_unused._M_object = (void *)0x0;
  local_5d8._8_8_ = 0;
  local_5c0 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:336:21)>
              ::_M_invoke;
  local_5c8 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:336:21)>
              ::_M_manager;
  s_58.location.location._M_impl =
       (source_location)(source_location)&PTR_s__workspace_llm4binary_github_lic_0026d458;
  s_58.value = "[/\\*]";
  trieste::operator>>((trieste *)local_9f8,s_58,(ParseEffect *)&local_5d8);
  r_01._M_len = 4;
  r_01._M_array = (iterator)local_a28;
  trieste::Parse::operator()(local_de0,(string *)&__a2,r_01);
  lVar8 = 0x38;
  do {
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a28 + lVar8));
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_5d8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_c88);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_dd8._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_c68);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_db8._M_refcount);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_5b8);
  ::std::__cxx11::string::~string((string *)&__a2);
  ::std::__shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2> *)local_a28,
             &start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>);
  local_c98 = (code *)0x0;
  pcStack_c90 = (code *)0x0;
  local_ca8._M_unused._M_object = (void *)0x0;
  local_ca8._8_8_ = 0;
  local_ca8._M_unused._M_object = operator_new(0x10);
  auVar7 = auStack_a20;
  auVar6 = local_a28;
  auStack_a20 = (undefined1  [8])0x0;
  local_a28 = (undefined1  [8])0x0;
  *(undefined1 (*) [8])local_ca8._M_unused._0_8_ = auVar6;
  *(undefined1 (*) [8])((long)local_ca8._M_unused._0_8_ + 8) = auVar7;
  pcStack_c90 = ::std::
                _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:339:12)>
                ::_M_invoke;
  local_c98 = ::std::
              _Function_handler<void_(trieste::detail::Make_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:339:12)>
              ::_M_manager;
  ::std::function<void_(trieste::detail::Make_&)>::operator=
            (&local_de0->done_,(function<void_(trieste::detail::Make_&)> *)&local_ca8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_ca8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)auStack_a20);
  local_5f8._M_unused._M_object = (void *)0x0;
  local_5f8._8_8_ = 0;
  local_5e0 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:350:14)>
              ::_M_invoke;
  local_5e8 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:350:14)>
              ::_M_manager;
  local_a28 = (undefined1  [8])Int;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)auStack_a20,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_5f8);
  local_618._M_unused._M_object = (void *)0x0;
  local_618._8_8_ = 0;
  local_600 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:351:14)>
              ::_M_invoke;
  local_608 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:351:14)>
              ::_M_manager;
  local_a00 = Hex;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_9f8,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_618);
  local_638._M_unused._M_object = (void *)0x0;
  local_638._8_8_ = 0;
  local_620 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:352:14)>
              ::_M_invoke;
  local_628 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:352:14)>
              ::_M_manager;
  local_9d8 = Bin;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_9d0,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_638);
  local_658._M_unused._M_object = (void *)0x0;
  local_658._8_8_ = 0;
  local_640 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:354:9)>
              ::_M_invoke;
  local_648 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:354:9)>
              ::_M_manager;
  local_9b0 = Float;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_9a8,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_658);
  local_678._M_unused._M_object = (void *)0x0;
  local_678._8_8_ = 0;
  local_660 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:356:9)>
              ::_M_invoke;
  local_668 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:356:9)>
              ::_M_manager;
  local_988 = HexFloat;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_980,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_678);
  local_698._M_unused._M_object = (void *)0x0;
  local_698._8_8_ = 0;
  local_680 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:358:9)>
              ::_M_invoke;
  local_688 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:358:9)>
              ::_M_manager;
  local_960 = Char;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_958,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_698);
  local_6b8._M_unused._M_object = (void *)0x0;
  local_6b8._8_8_ = 0;
  local_6a0 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:362:9)>
              ::_M_invoke;
  local_6a8 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:362:9)>
              ::_M_manager;
  local_938 = Escaped;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_930,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_6b8);
  local_6d8._M_unused._M_object = (void *)0x0;
  local_6d8._8_8_ = 0;
  local_6c0 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:366:9)>
              ::_M_invoke;
  local_6c8 = ::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/src/parse.cc:366:9)>
              ::_M_manager;
  local_910 = String;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
  ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)local_908,
             (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(xoroshiro::detail::XorOshiro<unsigned_long,_unsigned_int,_55UL,_14UL,_36UL>_&)>
              *)&local_6d8);
  g._M_len = 8;
  g._M_array = (iterator)local_a28;
  trieste::Parse::gen(local_de0,g);
  lVar8 = 0x120;
  do {
    ::std::_Function_base::~_Function_base((_Function_base *)(local_a28 + lVar8));
    lVar8 = lVar8 + -0x28;
  } while (lVar8 != -0x20);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_6d8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_6b8);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_698);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_678);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_658);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_638);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_618);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_5f8);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&start_location.super___shared_ptr<trieste::Location,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&indent.
              super___shared_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&str.super___shared_ptr<Str,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&depth.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&re_dir.super___shared_ptr<re2::RE2,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return local_de0;
}

Assistant:

Parse parser()
  {
    struct Str
    {
      size_t start = 0;
      size_t end = 0;
    };

    Parse p(depth::subdirectories, wfParser);
    auto re_dir = std::make_shared<RE2>("[_[:alpha:]][_[:alnum:]]*?");
    auto depth = std::make_shared<size_t>(0);
    auto str = std::make_shared<Str>();
    auto indent = std::make_shared<std::vector<size_t>>();
    auto start_location = std::make_shared<Location>();
    indent->push_back(restart);

    p.prefile([](auto&, auto& path) { return path.extension() == ".verona"; });

    p.predir([re_dir](auto&, auto& path) {
      return RE2::FullMatch(path.filename().string(), *re_dir);
    });

    p.postparse([](auto& pp, auto& path, auto ast) {
      if (options().no_std)
        return;

      auto stdlib = pp.executable().parent_path() / "std";
      if (path != stdlib)
        ast << pp.sub_parse(stdlib);
    });

    p.postfile([indent, depth](auto&, auto&, auto) {
      *depth = 0;
      indent->clear();
      indent->push_back(restart);
    });

    p("start",
      {
        // Blank lines terminate.
        "\r?\n(?:[[:blank:]]*\r?\n)+([[:blank:]]*)" >>
          [indent](auto& m) {
            indent->back() = m.match(1).len;
            m.term(terminators);
          },

        // A newline that starts a brace block doesn't terminate.
        "\r?\n([[:blank:]]*(\\{)[[:blank:]]*)" >>
          [indent](auto& m) {
            indent->push_back(m.match(1).len);
            m.push(Brace, 2);
          },

        // A newline sometimes terminates.
        "\r?\n([[:blank:]]*)" >>
          [indent](auto& m) {
            size_t col = m.match(1).len;

            // If following a brace, don't terminate, but reset indentation.
            if (m.previous(Brace))
            {
              indent->back() = col;
              return;
            }

            // Don't terminate and don't reset indentation if:
            // * in an equals or list
            // * in a group and indented
            if (
              m.in(Equals) || m.in(List) ||
              (m.in(Group) && (col > indent->back())))
              return;

            // Otherwise, terminate and reset indentation.
            m.term(terminators);
            indent->back() = col;
          },

        // Whitespace between tokens.
        "[[:blank:]]+" >> [](auto&) {},

        // Terminator.
        ";" >> [](auto& m) { m.term(terminators); },

        // Lambda.
        "=>" >>
          [indent](auto& m) {
            indent->back() = m.match().linecol().second + 1;
            m.term(terminators);
            m.add(Arrow);
            m.term(terminators);
          },

        // List.
        "," >> [](auto& m) { m.seq(List, {Equals}); },

        // Parens.
        "(\\()[[:blank:]]*" >>
          [indent](auto& m) {
            indent->push_back(m.match().linecol().second + m.match().len);
            m.push(Paren, 1);
          },

        "\\)" >>
          [indent](auto& m) {
            indent->pop_back();
            m.term(terminators);
            m.pop(Paren);
          },

        // Square brackets.
        "(\\[)[[:blank:]]*" >>
          [indent](auto& m) {
            indent->push_back(m.match().linecol().second + m.match().len);
            m.push(Square, 1);
          },

        "\\]" >>
          [indent](auto& m) {
            indent->pop_back();
            m.term(terminators);
            m.pop(Square);
          },

        // Curly braces.
        "(\\{)[[:blank:]]*" >>
          [indent](auto& m) {
            indent->push_back(m.match().linecol().second + m.match().len);
            m.push(Brace, 1);
          },

        "\\}" >>
          [indent](auto& m) {
            indent->pop_back();
            m.term(terminators);
            m.pop(Brace);
          },

        // Bool.
        "true\\b" >> [](auto& m) { m.add(True); },
        "false\\b" >> [](auto& m) { m.add(False); },

        // Hex float.
        "0x[_[:xdigit:]]+\\.[_[:xdigit:]]+(?:p[+-][_[:digit:]]+)?\\b" >>
          [](auto& m) { m.add(HexFloat); },

        // Float.
        "[[:digit:]][_[:digit:]]*\\.[_[:digit:]]+(?:e[+-]?[_[:digit:]]+)?\\b" >>
          [](auto& m) { m.add(Float); },

        // Bin.
        "0b[_01]+\\b" >> [](auto& m) { m.add(Bin); },

        // Oct.
        "0o[_01234567]+\\b" >> [](auto& m) { m.add(Oct); },

        // Hex.
        "0x[_[:xdigit:]]+\\b" >> [](auto& m) { m.add(Hex); },

        // Int.
        "[[:digit:]][_[:digit:]]*\\b" >> [](auto& m) { m.add(Int); },

        // Escaped string.
        "\"((?:\\\"|[^\"])*?)\"" >> [](auto& m) { m.add(Escaped, 1); },

        // Unescaped string.
        "([']+)\"([^\"]*)" >>
          [str, start_location](auto& m) {
            str->start = m.match(1).len;
            str->end = 0;
            m.add(String, 2);
            *start_location = m.match(1);
            m.mode("string");
          },

        // Character literal.
        "'((?:\\'|[^'])*)'" >> [](auto& m) { m.add(Char, 1); },

        // LLVM IR literal.
        ":\\[((?:[^\\]]|\\][^:])*)\\]:" >> [](auto& m) { m.add(LLVM, 1); },

        // Line comment.
        "//[^\r\n]*" >> [](auto&) {},

        // Nested comment.
        "/\\*" >>
          [depth, start_location](auto& m) {
            assert(*depth == 0);
            ++(*depth);
            *start_location = m.match();
            m.mode("comment");
          },

        // Keywords.
        "use\\b" >>
          [](auto& m) {
            m.term(terminators);
            m.add(Use);
          },

        "type\\b" >>
          [](auto& m) {
            m.term(terminators);
            m.add(TypeAlias);
          },

        "class\\b" >>
          [](auto& m) {
            m.term(terminators);
            m.add(Class);
          },

        "where\\b" >> [](auto& m) { m.add(Where); },
        "var\\b" >> [](auto& m) { m.add(Var); },
        "let\\b" >> [](auto& m) { m.add(Let); },
        "ref\\b" >> [](auto& m) { m.add(Ref); },
        "Self\\b" >> [](auto& m) { m.add(Self); },
        "if\\b" >> [](auto& m) { m.add(If); },
        "else\\b" >> [](auto& m) { m.add(Else); },
        "new\\b" >> [](auto& m) { m.add(New); },
        "try\\b" >> [](auto& m) { m.add(Try); },
        "iso\\b" >> [](auto& m) { m.add(Iso); },
        "mut\\b" >> [](auto& m) { m.add(Mut); },
        "imm\\b" >> [](auto& m) { m.add(Imm); },

        // Don't care.
        "_\\b" >> [](auto& m) { m.add(DontCare); },

        // Reserve a sequence of underscores.
        "_(?:_)+\\b" >>
          [](auto& m) {
            m.error(
              "a sequence of two or more underscores is a reserved identifier");
          },

        // Identifier.
        "[_[:alpha:]][_[:alnum:]]*\\b" >> [](auto& m) { m.add(Ident); },

        // Ellipsis.
        "\\.\\.\\." >> [](auto& m) { m.add(Ellipsis); },

        // Dot.
        "\\." >> [](auto& m) { m.add(Dot); },

        // Triple colon.
        ":::" >> [](auto& m) { m.add(TripleColon); },

        // Double colon.
        "::" >> [](auto& m) { m.add(DoubleColon); },

        // Colon.
        ":" >> [](auto& m) { m.add(Colon); },

        // Symbol that starts with `=`.
        "=[!#$%&*+-/<=>?@\\^`|~]+" >> [](auto& m) { m.add(Symbol); },

        // Equals.
        "=" >> [](auto& m) { m.seq(Equals); },

        // Other symbols. Reserved: "'(),.:;[]_{}
        "[!#$%&*+-/<=>?@\\^`|~]+" >> [](auto& m) { m.add(Symbol); },
      });

    p("string",
      {
        "\"'" >>
          [str](auto& m) {
            m.extend_before(String);
            str->end = 1;
            if (str->start == str->end)
              m.mode("start");
          },

        "'" >>
          [str](auto& m) {
            if (str->end > 0)
            {
              str->end++;
              if (str->start == str->end)
                m.mode("start");
            }
          },

        "." >> [str](auto&) { str->end = 0; },
      });

    p("comment",
      {
        "[^/\\*]+" >> [](auto&) {},
        "/\\*" >> [depth](auto&) { ++(*depth); },

        "\\*/" >>
          [depth](auto& m) {
            if (--(*depth) == 0)
              m.mode("start");
          },

        "[/\\*]" >> [](auto&) {},
      });

    p.done([start_location](auto& m) {
      if (m.mode() == "comment")
        m.error("Unterminated comment starting at ", *start_location);

      if (m.mode() == "string")
        m.error("Unterminated string starting at ", *start_location);

      m.term(terminators);
    });

    p.gen({
      Int >> [](auto& rnd) { return std::to_string(rnd()); },
      Hex >> [](auto& rnd) { return fmt::format("{:#x}", rnd()); },
      Bin >> [](auto& rnd) { return fmt::format("{:#b}", rnd()); },
      Float >>
        [](auto& rnd) { return fmt::format("{:g}", random_double(rnd)); },
      HexFloat >>
        [](auto& rnd) { return fmt::format("{:a}", random_double(rnd)); },
      Char >>
        [](auto& rnd) {
          return unquote(fmt::format("{:?}", random_string(rnd, 1)));
        },
      Escaped >>
        [](auto& rnd) {
          return unquote(fmt::format("{:?}", random_string(rnd, 32)));
        },
      String >>
        [](auto& rnd) { return fmt::format("{}", random_string(rnd, 32)); },
    });

    return p;
  }